

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall
t_xml_generator::write_element_string(t_xml_generator *this,string *name,string *val)

{
  ostream *poVar1;
  t_xml_generator *this_00;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->should_use_namespaces_ == true) && (this->should_use_default_ns_ == false)) {
    std::operator+(&local_48,"idl:",name);
    std::__cxx11::string::operator=((string *)name,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  close_top_element(this);
  this->top_element_is_empty = false;
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_xml_,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"<");
  poVar1 = std::operator<<(poVar1,(string *)name);
  this_00 = (t_xml_generator *)0x2d4517;
  poVar1 = std::operator<<(poVar1,">");
  escape_xml_string(&sStack_68,this_00,val);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_xml_generator::write_element_string(string name, string val) {
  if (should_use_namespaces_ && !should_use_default_ns_) {
    name = "idl:" + name;
  }
  close_top_element();
  top_element_is_empty = false;
  f_xml_ << indent()
    << "<" << name << ">" << escape_xml_string(val) << "</" << name << ">"
    << endl;
}